

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O3

bool __thiscall
graph_utils::
Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
::Unite(Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,
       basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  long lVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  bool bVar6;
  byte bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> u_rep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v_rep;
  undefined1 local_a0 [32];
  bool local_80;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_78;
  bool local_58;
  key_type local_50;
  
  Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )&local_78,this,u);
  bVar7 = 1;
  if (local_58 == true) {
    Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_a0,this,v);
    bVar7 = local_80 ^ 1;
    if ((bVar7 == 0) && (local_80 = false, (undefined1 *)local_a0._0_8_ != local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
  }
  lVar1 = (long)&local_78._M_value + 0x10;
  if (((local_58 & 1U) != 0) &&
     (local_58 = false, local_78._M_value._M_dataplus._M_p != (_Alloc_hider)lVar1)) {
    operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
  }
  if (bVar7 == 0) {
    Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_78,this,u);
    if (local_78._M_value._M_dataplus._M_p == (_Alloc_hider)lVar1) {
      local_a0._24_8_ = local_78._24_8_;
      local_a0._0_8_ = local_a0 + 0x10;
    }
    else {
      local_a0._0_8_ = local_78._M_value._M_dataplus._M_p;
    }
    local_a0._16_8_ = local_78._16_8_;
    local_a0._8_8_ = local_78._M_value._M_string_length;
    Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_78,this,v);
    if (local_78._M_value._M_dataplus._M_p == (_Alloc_hider)lVar1) {
      local_50.field_2._8_8_ = local_78._24_8_;
      local_78._M_value._M_dataplus._M_p = (_Alloc_hider)&local_50.field_2;
    }
    local_50.field_2._M_allocated_capacity = local_78._16_8_;
    local_50._M_string_length = local_78._M_value._M_string_length;
    local_50._M_dataplus._M_p = (pointer)local_78._M_value._M_dataplus._M_p;
    if ((local_a0._8_8_ == local_78._M_value._M_string_length) &&
       ((local_78._M_value._M_string_length == 0 ||
        (iVar2 = bcmp((void *)local_a0._0_8_,(void *)local_78._M_value._M_dataplus._M_p,
                      local_78._M_value._M_string_length), iVar2 == 0)))) {
      bVar6 = false;
    }
    else {
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->size_)._M_h,(key_type *)local_a0);
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->size_)._M_h,&local_50);
      if (*(ulong *)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                           ._M_cur + 0x28) <
          *(ulong *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                           ._M_cur + 0x28)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_50);
      }
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,&local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)iVar5.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      *(long *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      ._M_cur + 0x28) =
           *(long *)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                           ._M_cur + 0x28) +
           *(long *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                           ._M_cur + 0x28);
      bVar6 = true;
      local_78._M_value._M_dataplus._M_p = (_Alloc_hider)local_50._M_dataplus._M_p;
    }
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)&local_50.field_2) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,
                      local_50.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Unite(const Type& u, const Type& v) {
    if (!Find(u) || !Find(v))
      return false;
    Type u_rep = *Find(u);
    Type v_rep = *Find(v);
    if (!TypeEqual(u_rep, v_rep)) {
      auto u_rep_size_it = size_.find(u_rep);
      auto v_rep_size_it = size_.find(v_rep);
      if (u_rep_size_it->second < v_rep_size_it->second)
        std::swap(u_rep, v_rep);
      parent_.find(v_rep)->second = u_rep;
      u_rep_size_it->second += v_rep_size_it->second;
      return true;
    }
    return false;
  }